

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

ValueType *
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::GetValidateErrorKeyword(ValidateErrorCode validateErrorCode)

{
  ValueType *pVVar1;
  
  switch(validateErrorCode) {
  case kValidateErrorMultipleOf:
    pVVar1 = GetMultipleOfString();
    return pVVar1;
  case kValidateErrorMaximum:
  case kValidateErrorExclusiveMaximum:
    pVVar1 = GetMaximumString();
    return pVVar1;
  case kValidateErrorMinimum:
  case kValidateErrorExclusiveMinimum:
    pVVar1 = GetMinimumString();
    return pVVar1;
  case kValidateErrorMaxLength:
    pVVar1 = GetMaxLengthString();
    return pVVar1;
  case kValidateErrorMinLength:
    pVVar1 = GetMinLengthString();
    return pVVar1;
  case kValidateErrorPattern:
    pVVar1 = GetPatternString();
    return pVVar1;
  case kValidateErrorMaxItems:
    pVVar1 = GetMaxItemsString();
    return pVVar1;
  case kValidateErrorMinItems:
    pVVar1 = GetMinItemsString();
    return pVVar1;
  case kValidateErrorUniqueItems:
    pVVar1 = GetUniqueItemsString();
    return pVVar1;
  case kValidateErrorAdditionalItems:
    pVVar1 = GetAdditionalItemsString();
    return pVVar1;
  case kValidateErrorMaxProperties:
    pVVar1 = GetMaxPropertiesString();
    return pVVar1;
  case kValidateErrorMinProperties:
    pVVar1 = GetMinPropertiesString();
    return pVVar1;
  case kValidateErrorRequired:
    pVVar1 = GetRequiredString();
    return pVVar1;
  case kValidateErrorAdditionalProperties:
    pVVar1 = GetAdditionalPropertiesString();
    return pVVar1;
  case kValidateErrorPatternProperties:
    pVVar1 = GetPatternPropertiesString();
    return pVVar1;
  case kValidateErrorDependencies:
    pVVar1 = GetDependenciesString();
    return pVVar1;
  case kValidateErrorEnum:
    pVVar1 = GetEnumString();
    return pVVar1;
  case kValidateErrorType:
    pVVar1 = GetTypeString();
    return pVVar1;
  case kValidateErrorOneOf:
  case kValidateErrorOneOfMatch:
    pVVar1 = GetOneOfString();
    return pVVar1;
  case kValidateErrorAllOf:
    pVVar1 = GetAllOfString();
    return pVVar1;
  case kValidateErrorAnyOf:
    pVVar1 = GetAnyOfString();
    return pVVar1;
  case kValidateErrorNot:
    pVVar1 = GetNotString();
    return pVVar1;
  case kValidateErrorReadOnly:
    pVVar1 = GetReadOnlyString();
    return pVVar1;
  case kValidateErrorWriteOnly:
    pVVar1 = GetWriteOnlyString();
    return pVVar1;
  }
  if (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
      ::GetNullString()::v == '\0') {
    Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
    ::GetNullString();
  }
  return &GetNullString::v;
}

Assistant:

static const ValueType& GetValidateErrorKeyword(ValidateErrorCode validateErrorCode) {
        switch (validateErrorCode) {
            case kValidateErrorMultipleOf:              return GetMultipleOfString();
            case kValidateErrorMaximum:                 return GetMaximumString();
            case kValidateErrorExclusiveMaximum:        return GetMaximumString(); // Same
            case kValidateErrorMinimum:                 return GetMinimumString();
            case kValidateErrorExclusiveMinimum:        return GetMinimumString(); // Same

            case kValidateErrorMaxLength:               return GetMaxLengthString();
            case kValidateErrorMinLength:               return GetMinLengthString();
            case kValidateErrorPattern:                 return GetPatternString();

            case kValidateErrorMaxItems:                return GetMaxItemsString();
            case kValidateErrorMinItems:                return GetMinItemsString();
            case kValidateErrorUniqueItems:             return GetUniqueItemsString();
            case kValidateErrorAdditionalItems:         return GetAdditionalItemsString();

            case kValidateErrorMaxProperties:           return GetMaxPropertiesString();
            case kValidateErrorMinProperties:           return GetMinPropertiesString();
            case kValidateErrorRequired:                return GetRequiredString();
            case kValidateErrorAdditionalProperties:    return GetAdditionalPropertiesString();
            case kValidateErrorPatternProperties:       return GetPatternPropertiesString();
            case kValidateErrorDependencies:            return GetDependenciesString();

            case kValidateErrorEnum:                    return GetEnumString();
            case kValidateErrorType:                    return GetTypeString();

            case kValidateErrorOneOf:                   return GetOneOfString();
            case kValidateErrorOneOfMatch:              return GetOneOfString(); // Same
            case kValidateErrorAllOf:                   return GetAllOfString();
            case kValidateErrorAnyOf:                   return GetAnyOfString();
            case kValidateErrorNot:                     return GetNotString();

            case kValidateErrorReadOnly:                return GetReadOnlyString();
            case kValidateErrorWriteOnly:               return GetWriteOnlyString();

            default:                                    return GetNullString();
        }
    }